

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O1

void __thiscall
Js::ByteCodeWriter::UpdateNextBranchIslandOffset
          (ByteCodeWriter *this,uint firstUnknownJumpInfo,uint firstUnknownJumpOffset)

{
  bool bVar1;
  int iVar2;
  
  this->firstUnknownJumpInfo = firstUnknownJumpInfo;
  bVar1 = ConfigFlagsTable::IsEnabled
                    ((ConfigFlagsTable *)&Configuration::Global,ByteCodeBranchLimitFlag);
  iVar2 = 0x8000;
  if (bVar1) {
    iVar2 = 0x40;
    if (0x40 < DAT_015b5fb8) {
      iVar2 = DAT_015b5fb8;
    }
    if (0x7fff < iVar2) {
      iVar2 = 0x8000;
    }
  }
  this->nextBranchIslandOffset =
       ((this->m_jumpOffsets->
        super_ReadOnlyList<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_DefaultComparer>).
        count - firstUnknownJumpInfo) * -7 + firstUnknownJumpOffset + iVar2 + -0x51;
  return;
}

Assistant:

void ByteCodeWriter::UpdateNextBranchIslandOffset(uint firstUnknownJumpInfo, uint firstUnknownJumpOffset)
    {
        this->firstUnknownJumpInfo = firstUnknownJumpInfo;

        // We will need to emit the next branch from the first branch + branch limit.
        // But leave room for the jump around and one extra byte code instruction.
        // Also account for all the long branches we may have to emit as well.
        this->nextBranchIslandOffset = firstUnknownJumpOffset + GetBranchLimit()
            - JumpAroundSize - MaxLayoutSize - MaxOpCodeSize - LongBranchSize * (m_jumpOffsets->Count() - firstUnknownJumpInfo);
    }